

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O0

ElabSystemTaskSymbol *
slang::ast::ElabSystemTaskSymbol::fromSyntax(Compilation *compilation,ElabSystemTaskSyntax *syntax)

{
  SourceLocation args;
  ElabSystemTaskSymbol *this;
  SyntaxNode *in_RSI;
  SourceLocation *in_RDI;
  ElabSystemTaskSymbol *result;
  ElabSystemTaskKind taskKind;
  undefined1 in_stack_00000060 [16];
  BumpAllocator *in_stack_ffffffffffffffd0;
  
  SemanticFacts::getElabSystemTaskKind((Token)in_stack_00000060);
  args = parsing::Token::location((Token *)&in_RSI[3].parent);
  this = BumpAllocator::
         emplace<slang::ast::ElabSystemTaskSymbol,slang::ast::ElabSystemTaskKind&,slang::SourceLocation>
                   (in_stack_ffffffffffffffd0,(ElabSystemTaskKind *)args,in_RDI);
  Symbol::setSyntax(&this->super_Symbol,in_RSI);
  return this;
}

Assistant:

ElabSystemTaskSymbol& ElabSystemTaskSymbol::fromSyntax(Compilation& compilation,
                                                       const ElabSystemTaskSyntax& syntax) {
    // Just create the symbol now. The diagnostic will be issued later
    // when someone visits the symbol and asks for it.
    auto taskKind = SemanticFacts::getElabSystemTaskKind(syntax.name);
    auto result = compilation.emplace<ElabSystemTaskSymbol>(taskKind, syntax.name.location());
    result->setSyntax(syntax);
    return *result;
}